

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O1

void __thiscall duckdb::TupleDataCollection::Initialize(TupleDataCollection *this)

{
  const_reference type;
  size_type __n;
  TupleDataLayout *this_00;
  TupleDataScatterFunction local_50;
  
  this->count = 0;
  this->data_size = 0;
  ::std::vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
  ::reserve(&(this->scatter_functions).
             super_vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
            ,((long)(this->layout->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->layout->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  ::std::vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
  reserve(&(this->gather_functions).
           super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
          ,((long)(this->layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  this_00 = this->layout;
  if ((this_00->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this_00->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      type = vector<duckdb::LogicalType,_true>::operator[](&this_00->types,__n);
      GetScatterFunction(&local_50,type,false);
      ::std::
      vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>::
      emplace_back<duckdb::TupleDataScatterFunction>
                (&(this->scatter_functions).
                  super_vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
                 ,&local_50);
      ::std::
      vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>::
      ~vector(&local_50.child_functions.
               super_vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
             );
      GetGatherFunction((TupleDataGatherFunction *)&local_50,type);
      ::std::
      vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
      emplace_back<duckdb::TupleDataGatherFunction>
                (&(this->gather_functions).
                  super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
                 ,(TupleDataGatherFunction *)&local_50);
      ::std::
      vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
      ~vector((vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
               *)&local_50.child_functions);
      this_00 = this->layout;
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this_00->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  return;
}

Assistant:

void TupleDataCollection::Initialize() {
	D_ASSERT(!layout.GetTypes().empty());
	this->count = 0;
	this->data_size = 0;
	scatter_functions.reserve(layout.ColumnCount());
	gather_functions.reserve(layout.ColumnCount());
	for (idx_t col_idx = 0; col_idx < layout.ColumnCount(); col_idx++) {
		auto &type = layout.GetTypes()[col_idx];
		scatter_functions.emplace_back(GetScatterFunction(type));
		gather_functions.emplace_back(GetGatherFunction(type));
	}
}